

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.hpp
# Opt level: O1

size_t __thiscall
zmq::encoder_base_t<zmq::v2_encoder_t>::encode
          (encoder_base_t<zmq::v2_encoder_t> *this,uchar **data_,size_t size_)

{
  int iVar1;
  code *pcVar2;
  uchar *puVar3;
  EVP_PKEY_CTX *ctx;
  ulong uVar4;
  size_t sVar5;
  
  puVar3 = *data_;
  if (puVar3 == (uchar *)0x0) {
    puVar3 = this->_buf;
    size_ = this->_buf_size;
  }
  if (this->_in_progress == (msg_t *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    ctx = (EVP_PKEY_CTX *)data_;
    if (size_ != 0) {
      do {
        if (this->_to_write == 0) {
          if (this->_new_msg_flag == true) {
            iVar1 = msg_t::close(this->_in_progress,(int)ctx);
            if (iVar1 != 0) {
              encode();
            }
            iVar1 = msg_t::init(this->_in_progress,ctx);
            if (iVar1 != 0) {
              encode();
            }
            this->_in_progress = (msg_t *)0x0;
            break;
          }
          pcVar2 = (code *)this->_next;
          if (((ulong)pcVar2 & 1) != 0) {
            pcVar2 = *(code **)(pcVar2 + *(long *)((long)&(this->super_i_encoder)._vptr_i_encoder +
                                                  *(long *)&this->field_0x20) + -1);
          }
          (*pcVar2)();
        }
        if ((sVar5 == 0) && (uVar4 = this->_to_write, size_ <= uVar4 && *data_ == (uchar *)0x0)) {
          *data_ = this->_write_pos;
          this->_write_pos = (uchar *)0x0;
          this->_to_write = 0;
          return uVar4;
        }
        ctx = (EVP_PKEY_CTX *)this->_write_pos;
        uVar4 = size_ - sVar5;
        if (this->_to_write <= size_ - sVar5) {
          uVar4 = this->_to_write;
        }
        memcpy(puVar3 + sVar5,ctx,uVar4);
        sVar5 = sVar5 + uVar4;
        this->_write_pos = this->_write_pos + uVar4;
        this->_to_write = this->_to_write - uVar4;
      } while (sVar5 < size_);
    }
    *data_ = puVar3;
  }
  return sVar5;
}

Assistant:

size_t encode (unsigned char **data_, size_t size_) ZMQ_FINAL
    {
        unsigned char *buffer = !*data_ ? _buf : *data_;
        const size_t buffersize = !*data_ ? _buf_size : size_;

        if (in_progress () == NULL)
            return 0;

        size_t pos = 0;
        while (pos < buffersize) {
            //  If there are no more data to return, run the state machine.
            //  If there are still no data, return what we already have
            //  in the buffer.
            if (!_to_write) {
                if (_new_msg_flag) {
                    int rc = _in_progress->close ();
                    errno_assert (rc == 0);
                    rc = _in_progress->init ();
                    errno_assert (rc == 0);
                    _in_progress = NULL;
                    break;
                }
                (static_cast<T *> (this)->*_next) ();
            }

            //  If there are no data in the buffer yet and we are able to
            //  fill whole buffer in a single go, let's use zero-copy.
            //  There's no disadvantage to it as we cannot stuck multiple
            //  messages into the buffer anyway. Note that subsequent
            //  write(s) are non-blocking, thus each single write writes
            //  at most SO_SNDBUF bytes at once not depending on how large
            //  is the chunk returned from here.
            //  As a consequence, large messages being sent won't block
            //  other engines running in the same I/O thread for excessive
            //  amounts of time.
            if (!pos && !*data_ && _to_write >= buffersize) {
                *data_ = _write_pos;
                pos = _to_write;
                _write_pos = NULL;
                _to_write = 0;
                return pos;
            }

            //  Copy data to the buffer. If the buffer is full, return.
            const size_t to_copy = std::min (_to_write, buffersize - pos);
            memcpy (buffer + pos, _write_pos, to_copy);
            pos += to_copy;
            _write_pos += to_copy;
            _to_write -= to_copy;
        }

        *data_ = buffer;
        return pos;
    }